

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O2

void __thiscall
S2LaxPolygonShape::Init
          (S2LaxPolygonShape *this,
          vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
          *loops)

{
  pointer pvVar1;
  Loop *loop;
  pointer __args;
  vector<absl::Span<const_Vector3<double>_>,_std::allocator<absl::Span<const_Vector3<double>_>_>_>
  spans;
  
  spans.
  super__Vector_base<absl::Span<const_Vector3<double>_>,_std::allocator<absl::Span<const_Vector3<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  spans.
  super__Vector_base<absl::Span<const_Vector3<double>_>,_std::allocator<absl::Span<const_Vector3<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  spans.
  super__Vector_base<absl::Span<const_Vector3<double>_>,_std::allocator<absl::Span<const_Vector3<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<absl::Span<const_Vector3<double>_>,_std::allocator<absl::Span<const_Vector3<double>_>_>_>::
  reserve(&spans,((long)(loops->
                        super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(loops->
                       super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pvVar1 = (loops->
           super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__args = (loops->
                super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; __args != pvVar1; __args = __args + 1) {
    std::vector<absl::Span<Vector3<double>const>,std::allocator<absl::Span<Vector3<double>const>>>::
    emplace_back<std::vector<Vector3<double>,std::allocator<Vector3<double>>>const&>
              ((vector<absl::Span<Vector3<double>const>,std::allocator<absl::Span<Vector3<double>const>>>
                *)&spans,__args);
  }
  Init(this,&spans);
  std::
  _Vector_base<absl::Span<const_Vector3<double>_>,_std::allocator<absl::Span<const_Vector3<double>_>_>_>
  ::~_Vector_base(&spans.
                   super__Vector_base<absl::Span<const_Vector3<double>_>,_std::allocator<absl::Span<const_Vector3<double>_>_>_>
                 );
  return;
}

Assistant:

void S2LaxPolygonShape::Init(const vector<S2LaxPolygonShape::Loop>& loops) {
  vector<Span<const S2Point>> spans;
  spans.reserve(loops.size());
  for (const S2LaxPolygonShape::Loop& loop : loops) {
    spans.emplace_back(loop);
  }
  Init(spans);
}